

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

aiString * __thiscall
Assimp::ColladaLoader::FindFilenameForEffectTexture
          (aiString *__return_storage_ptr__,ColladaLoader *this,ColladaParser *pParser,
          Effect *pEffect,string *pName)

{
  bool bVar1;
  pointer ppVar2;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *this_00;
  pointer ppVar4;
  aiTexture *this_01;
  char *pcVar5;
  ulong uVar6;
  Logger *pLVar7;
  char *__src;
  size_type sVar8;
  aiTexel *paVar9;
  const_reference __src_00;
  DeadlyImportError *this_02;
  allocator<char> local_269;
  string local_268;
  aiTexture *local_248;
  aiTexture *tex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_a0;
  _Self local_80;
  _Self local_78;
  const_iterator imIt;
  _Self local_58;
  const_iterator it;
  string name;
  string *pName_local;
  Effect *pEffect_local;
  ColladaParser *pParser_local;
  ColladaLoader *this_local;
  aiString *result;
  
  aiString::aiString(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&it,(string *)pName);
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
         ::find(&pEffect->mParams,(key_type *)&it);
    imIt._M_node = (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
                   ::end(&pEffect->mParams);
    bVar1 = std::operator==(&local_58,(_Self *)&imIt);
    if (bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>
             ::operator->(&local_58);
    std::__cxx11::string::operator=((string *)&it,(string *)&(ppVar2->second).mReference);
  }
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
       ::find(&pParser->mImageLibrary,(key_type *)&it);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
       ::end(&pParser->mImageLibrary);
  bVar1 = std::operator==(&local_78,&local_80);
  if (bVar1) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[50]>
              (&local_218,(char (*) [50])"Collada: Unable to resolve effect texture entry \"");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_218,pName);
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar3,(char (*) [20])"\", ended up at ID \"");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &it);
    this_00 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar3,(char (*) [3])0xa87e64);
    Formatter::basic_formatter::operator_cast_to_string(&local_a0,this_00);
    Logger::warn(pLVar7,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_218);
    std::operator+(&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,".jpg");
    aiString::Set(__return_storage_ptr__,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    ConvertPath(this,__return_storage_ptr__);
  }
  else {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
             ::operator->(&local_78);
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (&(ppVar4->second).mImageData);
    if (bVar1) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
      ::operator->(&local_78);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"Collada: Invalid texture, no data or file reference given",
                   &local_269);
        DeadlyImportError::DeadlyImportError(this_02,&local_268);
        __cxa_throw(this_02,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
               ::operator->(&local_78);
      aiString::Set(__return_storage_ptr__,&(ppVar4->second).mFileName);
      ConvertPath(this,__return_storage_ptr__);
    }
    else {
      this_01 = (aiTexture *)operator_new(0x428);
      aiTexture::aiTexture(this_01);
      local_248 = this_01;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
      ::operator->(&local_78);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      aiString::Set(&this_01->mFilename,pcVar5);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
               ::operator->(&local_78);
      aiString::Set(__return_storage_ptr__,&(ppVar4->second).mFileName);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
      ::operator->(&local_78);
      uVar6 = std::__cxx11::string::length();
      if (3 < uVar6) {
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,"Collada: texture format hint is too long, truncating to 3 characters");
      }
      pcVar5 = local_248->achFormatHint;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
      ::operator->(&local_78);
      __src = (char *)std::__cxx11::string::c_str();
      strncpy(pcVar5,__src,3);
      local_248->mHeight = 0;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
               ::operator->(&local_78);
      sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&(ppVar4->second).mImageData);
      local_248->mWidth = (uint)sVar8;
      paVar9 = (aiTexel *)operator_new__((ulong)local_248->mWidth);
      local_248->pcData = paVar9;
      paVar9 = local_248->pcData;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
               ::operator->(&local_78);
      __src_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&(ppVar4->second).mImageData,0);
      memcpy(paVar9,__src_00,(ulong)local_248->mWidth);
      std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::push_back(&this->mTextures,&local_248)
      ;
    }
  }
  tex._4_4_ = 1;
  std::__cxx11::string::~string((string *)&it);
  return __return_storage_ptr__;
}

Assistant:

aiString ColladaLoader::FindFilenameForEffectTexture(const ColladaParser& pParser,
    const Collada::Effect& pEffect, const std::string& pName)
{
    aiString result;

    // recurse through the param references until we end up at an image
    std::string name = pName;
    while (1)
    {
        // the given string is a param entry. Find it
        Collada::Effect::ParamLibrary::const_iterator it = pEffect.mParams.find(name);
        // if not found, we're at the end of the recursion. The resulting string should be the image ID
        if (it == pEffect.mParams.end())
            break;

        // else recurse on
        name = it->second.mReference;
    }

    // find the image referred by this name in the image library of the scene
    ColladaParser::ImageLibrary::const_iterator imIt = pParser.mImageLibrary.find(name);
    if (imIt == pParser.mImageLibrary.end())
    {
        ASSIMP_LOG_WARN_F("Collada: Unable to resolve effect texture entry \"", pName, "\", ended up at ID \"", name, "\".");

        //set default texture file name
        result.Set(name + ".jpg");
        ConvertPath(result);
        return result;
    }

    // if this is an embedded texture image setup an aiTexture for it
    if (!imIt->second.mImageData.empty())
    {
        aiTexture* tex = new aiTexture();

        // Store embedded texture name reference
        tex->mFilename.Set(imIt->second.mFileName.c_str());
        result.Set(imIt->second.mFileName);

        // TODO: check the possibility of using the flag "AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING"
//        result.data[0] = '*';
//        result.length = 1 + ASSIMP_itoa10(result.data + 1, static_cast<unsigned int>(MAXLEN - 1), static_cast<int32_t>(mTextures.size()));


        // setup format hint
        if (imIt->second.mEmbeddedFormat.length() > 3) {
            ASSIMP_LOG_WARN("Collada: texture format hint is too long, truncating to 3 characters");
        }
        strncpy(tex->achFormatHint, imIt->second.mEmbeddedFormat.c_str(), 3);

        // and copy texture data
        tex->mHeight = 0;
        tex->mWidth = static_cast<unsigned int>(imIt->second.mImageData.size());
        tex->pcData = (aiTexel*)new char[tex->mWidth];
        memcpy(tex->pcData, &imIt->second.mImageData[0], tex->mWidth);

        // and add this texture to the list
        mTextures.push_back(tex);
    }
    else
    {
        if (imIt->second.mFileName.empty()) {
            throw DeadlyImportError("Collada: Invalid texture, no data or file reference given");
        }

        result.Set(imIt->second.mFileName);
        ConvertPath(result);
    }
    return result;
}